

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LParser.h
# Opt level: O2

int __thiscall LParser::accept(LParser *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  LParserException *this_00;
  undefined4 in_register_00000034;
  allocator<char> local_31;
  string local_30;
  
  this_00 = (LParserException *)__cxa_allocate_exception(0x28,CONCAT44(in_register_00000034,__fd));
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"ACCEPT",&local_31);
  LParserException::LParserException(this_00,&local_30);
  __cxa_throw(this_00,&LParserException::typeinfo,LParserException::~LParserException);
}

Assistant:

void accept() {
        throw LParserException("ACCEPT");
    }